

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minijson_reader.hpp
# Opt level: O0

pair<minijson::value,_char> *
minijson::detail::read_value<minijson::buffer_context>
          (pair<minijson::value,_char> *__return_storage_ptr__,buffer_context *context,
          char first_char)

{
  char *buffer;
  value local_128;
  char local_105;
  int local_104;
  undefined1 local_100 [3];
  char ending_char;
  pair<minijson::value,_int> local_e0;
  int local_b4;
  value local_b0;
  pair<minijson::value,_int> local_90;
  int local_64;
  value local_60;
  pair<minijson::value,_int> local_40;
  char local_11;
  buffer_context_base *pbStack_10;
  char first_char_local;
  buffer_context *context_local;
  
  local_11 = first_char;
  pbStack_10 = &context->super_buffer_context_base;
  if (first_char == '{') {
    value::value(&local_60,Object,"",0,0.0);
    local_64 = 0;
    std::make_pair<minijson::value,int>(&local_40,&local_60,&local_64);
    std::pair<minijson::value,_char>::pair<minijson::value,_int,_true>
              (__return_storage_ptr__,&local_40);
  }
  else if (first_char == '[') {
    value::value(&local_b0,Array,"",0,0.0);
    local_b4 = 0;
    std::make_pair<minijson::value,int>(&local_90,&local_b0,&local_b4);
    std::pair<minijson::value,_char>::pair<minijson::value,_int,_true>
              (__return_storage_ptr__,&local_90);
  }
  else if (first_char == '\"') {
    buffer_context_base::new_write_buffer(&context->super_buffer_context_base);
    read_quoted_string<minijson::buffer_context>((buffer_context *)pbStack_10,true);
    buffer = buffer_context_base::write_buffer(pbStack_10);
    value::value((value *)local_100,String,buffer,0,0.0);
    local_104 = 0;
    std::make_pair<minijson::value,int>(&local_e0,(value *)local_100,&local_104);
    std::pair<minijson::value,_char>::pair<minijson::value,_int,_true>
              (__return_storage_ptr__,&local_e0);
  }
  else {
    buffer_context_base::new_write_buffer(&context->super_buffer_context_base);
    local_105 = read_unquoted_value<minijson::buffer_context>((buffer_context *)pbStack_10,local_11)
    ;
    parse_unquoted_value<minijson::buffer_context>(&local_128,(buffer_context *)pbStack_10);
    std::make_pair<minijson::value,char_const&>(__return_storage_ptr__,&local_128,&local_105);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<value, char> read_value(Context& context, char first_char)
{
    if (first_char == '{')
    {
        return std::make_pair(value(Object), 0);
    }
    else if (first_char == '[')
    {
        return std::make_pair(value(Array), 0);
    }
    else if (first_char == '"') // quoted string
    {
        context.new_write_buffer();
        read_quoted_string(context, true);

        return std::make_pair(value(String, context.write_buffer()), 0);
    }
    else // unquoted value
    {
        context.new_write_buffer();
        const char ending_char = read_unquoted_value(context, first_char);

        return std::make_pair(parse_unquoted_value(context), ending_char);
    }
}